

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O0

bool __thiscall LSMTree::del(LSMTree *this,longlong key)

{
  byte bVar1;
  size_t sVar2;
  MemTable *this_00;
  string local_40;
  longlong local_20;
  longlong key_local;
  LSMTree *this_local;
  
  local_20 = key;
  key_local = (longlong)this;
  get_abi_cxx11_(&local_40,this,key);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_40);
  if ((bVar1 & 1) == 0) {
    (*(this->memory->
      super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      )._vptr_Dictionary[3])(this->memory,local_20);
    sVar2 = MemTable::size_bytes(this->memory);
    if ((ulong)(long)this->MEMTABLE_LIMIT < sVar2) {
      DiskTable::persistent(this->disk,this->memory,true);
      this_00 = (MemTable *)operator_new(0x30);
      MemTable::MemTable(this_00);
      this->memory = this_00;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LSMTree::del(long long key) {
    if (get(key).empty()) {
        return false;
    }
    memory->remove(key);
    if (memory->size_bytes() > MEMTABLE_LIMIT) {
        disk->persistent(std::move(*memory), true);
        memory = new MemTable{};
    }
    return true;
}